

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1523.c
# Opt level: O1

int test(char *URL)

{
  CURLcode CVar1;
  CURLcode CVar2;
  CURL *hnd;
  time_t tVar3;
  char buffer [256];
  undefined1 auStack_128 [264];
  
  hnd = (CURL *)curl_easy_init();
  curl_easy_setopt(hnd,0x2712,URL);
  curl_easy_setopt(hnd,0x4e2b,write_cb);
  curl_easy_setopt(hnd,0x271a,auStack_128);
  curl_easy_setopt(hnd,0x2b,0);
  curl_easy_setopt(hnd,0x4efb,dload_progress_cb);
  tVar3 = time((time_t *)0x0);
  curl_mprintf("Start: %d\n",tVar3);
  CVar1 = run(hnd,1,2);
  if (CVar1 != CURLE_OK) {
    curl_mfprintf(_stderr,"error %d: %s\n",CVar1,auStack_128);
  }
  CVar2 = run(hnd,12000,1);
  CVar1 = CURLE_OK;
  if (CVar2 != CURLE_OPERATION_TIMEDOUT) {
    curl_mfprintf(_stderr,"error %d: %s\n",CVar2,auStack_128);
    CVar1 = CVar2;
  }
  tVar3 = time((time_t *)0x0);
  curl_mprintf("End: %d\n",tVar3);
  curl_easy_cleanup(hnd);
  return CVar1;
}

Assistant:

int test(char *URL)
{
  CURLcode ret;
  CURL *hnd = curl_easy_init();
  char buffer[CURL_ERROR_SIZE];
  curl_easy_setopt(hnd, CURLOPT_URL, URL);
  curl_easy_setopt(hnd, CURLOPT_WRITEFUNCTION, write_cb);
  curl_easy_setopt(hnd, CURLOPT_ERRORBUFFER, buffer);
  curl_easy_setopt(hnd, CURLOPT_NOPROGRESS, 0L);
  curl_easy_setopt(hnd, CURLOPT_XFERINFOFUNCTION, dload_progress_cb);

  printf("Start: %d\n", time(NULL));
  ret = run(hnd, 1, 2);
  if(ret)
    fprintf(stderr, "error %d: %s\n", ret, buffer);

  ret = run(hnd, 12000, 1);
  if(ret != CURLE_OPERATION_TIMEDOUT)
    fprintf(stderr, "error %d: %s\n", ret, buffer);
  else
    ret = 0;

  printf("End: %d\n", time(NULL));
  curl_easy_cleanup(hnd);

  return (int)ret;
}